

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int unqliteKvIoPageUnRef(unqlite_page *pPage)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  Pager *pPager;
  Page *pPVar4;
  Page **ppPVar5;
  Page **ppPVar6;
  
  if (pPage == (unqlite_page *)0x0) {
    return 0;
  }
  lVar3 = **(long **)pPage[1].zData;
  if ((lVar3 != 0) && ((*(long **)pPage[1].zData)[6] != 0)) {
    (**(code **)(lVar3 + 0x20))();
  }
  iVar1 = *(int *)((long)&pPage[1].pUserData + 4);
  *(int *)((long)&pPage[1].pUserData + 4) = iVar1 + -1;
  lVar3 = **(long **)pPage[1].zData;
  if ((lVar3 != 0) && ((*(long **)pPage[1].zData)[6] != 0)) {
    (**(code **)(lVar3 + 0x30))();
  }
  if (iVar1 != 0) {
    return 0;
  }
  pPager = (Pager *)pPage[1].zData;
  uVar2 = *(uint *)&pPage[1].pUserData;
  if ((uVar2 & 2) == 0) {
    pager_unlink_page(pPager,(Page *)pPage);
    pager_release_page(pPager,(Page *)pPage);
    return 0;
  }
  if ((uVar2 & 0xc0) != 0) {
    return 0;
  }
  pPage[4].zData = (uchar *)0x0;
  ppPVar6 = &pPager->pHotDirty;
  if (pPager->pFirstHot == (Page *)0x0) {
    ppPVar5 = &pPager->pFirstHot;
  }
  else {
    pPVar4 = *ppPVar6;
    pPage[3].iPage = (pgno)pPVar4;
    ppPVar5 = ppPVar6;
    if (pPVar4 == (Page *)0x0) goto LAB_00116505;
    ppPVar6 = &pPVar4->pPrevHot;
  }
  *ppPVar6 = (Page *)pPage;
LAB_00116505:
  *ppPVar5 = (Page *)pPage;
  pPager->nHot = pPager->nHot + 1;
  *(uint *)&pPage[1].pUserData = uVar2 | 0x40;
  return 0;
}

Assistant:

static int unqliteKvIoPageUnRef(unqlite_page *pPage)
{
	if( pPage ){
		page_unref((Page *)pPage);
	}
	return UNQLITE_OK;
}